

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  byte *pbVar5;
  Ch *pCVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  Ch *pCVar10;
  long lVar11;
  ulong v;
  undefined4 uVar12;
  int iVar13;
  SizeType SVar14;
  uint v_00;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  byte *pbVar19;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  cVar2 = *is->src_;
  if (cVar2 == '\"') {
    ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
              (this,is,handler,false);
    return;
  }
  if (cVar2 == '[') {
    is->src_ = is->src_ + 1;
    bVar22 = VWReaderHandler<false>::StartArray(handler);
    if (bVar22) {
      SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        SVar14 = 0;
      }
      else {
        SVar14 = 1;
        while( true ) {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ',') break;
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          SVar14 = SVar14 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar4 != ']') {
          lVar11 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_001a0f04;
        }
        is->src_ = pcVar4 + 1;
      }
      bVar22 = VWReaderHandler<false>::EndArray(handler,SVar14);
      if (bVar22) {
        return;
      }
    }
    lVar11 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_001a0f04:
    *(long *)(this + 0x38) = lVar11;
    return;
  }
  if (cVar2 == 'f') {
    pCVar6 = is->src_;
    pCVar10 = pCVar6 + 1;
    is->src_ = pCVar10;
    uVar12 = 3;
    if (pCVar6[1] == 'a') {
      pCVar10 = pCVar6 + 2;
      is->src_ = pCVar10;
      if (pCVar6[2] == 'l') {
        pCVar10 = pCVar6 + 3;
        is->src_ = pCVar10;
        if (pCVar6[3] == 's') {
          pCVar10 = pCVar6 + 4;
          is->src_ = pCVar10;
          if (pCVar6[4] == 'e') {
            is->src_ = pCVar6 + 5;
            bVar22 = VWReaderHandler<false>::Bool(handler,false);
            if (bVar22) {
              return;
            }
            pCVar10 = is->src_;
            uVar12 = 0x10;
          }
        }
      }
    }
    pCVar6 = is->head_;
    *(undefined4 *)(this + 0x30) = uVar12;
    *(long *)(this + 0x38) = (long)pCVar10 - (long)pCVar6;
    return;
  }
  if (cVar2 == '{') {
    is->src_ = is->src_ + 1;
    bVar22 = VWReaderHandler<false>::StartObject(handler);
    if (bVar22) {
      SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == '}') {
        is->src_ = is->src_ + 1;
        SVar14 = 0;
      }
      else {
        SVar14 = 1;
        while( true ) {
          if (*is->src_ != '\"') {
            lVar11 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 4;
            goto LAB_001a0dab;
          }
          ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ':') {
            lVar11 = (long)pcVar4 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_001a0dab;
          }
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ',') break;
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          SVar14 = SVar14 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar4 != '}') {
          lVar11 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_001a0dab;
        }
        is->src_ = pcVar4 + 1;
      }
      bVar22 = VWReaderHandler<false>::EndObject(handler,SVar14);
      if (bVar22) {
        return;
      }
    }
    lVar11 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_001a0dab:
    *(long *)(this + 0x38) = lVar11;
    return;
  }
  if (cVar2 == 't') {
    pCVar6 = is->src_;
    pCVar10 = pCVar6 + 1;
    is->src_ = pCVar10;
    uVar12 = 3;
    if (pCVar6[1] == 'r') {
      pCVar10 = pCVar6 + 2;
      is->src_ = pCVar10;
      if (pCVar6[2] == 'u') {
        pCVar10 = pCVar6 + 3;
        is->src_ = pCVar10;
        if (pCVar6[3] == 'e') {
          is->src_ = pCVar6 + 4;
          bVar22 = VWReaderHandler<false>::Bool(handler,true);
          if (bVar22) {
            return;
          }
          pCVar10 = is->src_;
          uVar12 = 0x10;
        }
      }
    }
    pCVar6 = is->head_;
    *(undefined4 *)(this + 0x30) = uVar12;
    *(long *)(this + 0x38) = (long)pCVar10 - (long)pCVar6;
    return;
  }
  if (cVar2 == 'n') {
    ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
              (this,is,handler);
    return;
  }
  pbVar5 = (byte *)is->src_;
  bVar3 = *pbVar5;
  pbVar20 = pbVar5;
  bVar9 = bVar3;
  if (bVar3 == 0x2d) {
    pbVar20 = pbVar5 + 1;
    bVar9 = pbVar5[1];
  }
  pCVar10 = is->dst_;
  pCVar6 = is->head_;
  uVar12 = 0xd;
  if (bVar9 == 0x30) {
    bVar9 = pbVar20[1];
    pbVar19 = pbVar20 + 1;
    uVar21 = 0;
    v_00 = 0;
LAB_001a10d6:
    uVar16 = (uint)bVar9;
    bVar22 = false;
    bVar8 = false;
    v = 0;
    dVar23 = 0.0;
    bVar7 = false;
    goto LAB_001a11a5;
  }
  if ((byte)(bVar9 - 0x31) < 9) {
    v_00 = bVar9 - 0x30;
    uVar21 = 0;
    if (bVar3 == 0x2d) {
      while( true ) {
        bVar9 = pbVar20[uVar21 + 1];
        uVar17 = (ulong)bVar9;
        if (9 < (byte)(bVar9 - 0x30)) break;
        if (0xccccccb < v_00) {
          uVar16 = v_00;
          if (v_00 != 0xccccccc) goto LAB_001a106b;
          if (0x38 < bVar9) {
            uVar17 = 0x39;
            uVar16 = 0xccccccc;
            goto LAB_001a106b;
          }
        }
        v_00 = (v_00 * 10 + (uint)bVar9) - 0x30;
        uVar21 = uVar21 + 1;
      }
    }
    else {
      while( true ) {
        bVar9 = pbVar20[uVar21 + 1];
        uVar17 = (ulong)bVar9;
        if (9 < (byte)(bVar9 - 0x30)) break;
        if ((0x19999998 < v_00) &&
           ((uVar16 = v_00, v_00 != 0x19999999 || (uVar16 = 0x19999999, 0x35 < bVar9))))
        goto LAB_001a106b;
        v_00 = (v_00 * 10 + (uint)bVar9) - 0x30;
        uVar21 = uVar21 + 1;
      }
    }
    pbVar19 = pbVar20 + uVar21 + 1;
    goto LAB_001a10d6;
  }
  uVar12 = 3;
  pbVar19 = pbVar20;
  goto LAB_001a1470;
LAB_001a106b:
  v_00 = uVar16;
  pbVar19 = pbVar20 + uVar21 + 1;
  v = (ulong)v_00;
  if (bVar3 == 0x2d) {
    while( true ) {
      uVar16 = (uint)uVar17;
      if (9 < (byte)((byte)uVar17 - 0x30)) break;
      if ((0xccccccccccccccb < v) && (0x38 < (byte)uVar17 || v != 0xccccccccccccccc))
      goto LAB_001a112e;
      v = (uVar17 & 0xf) + v * 10;
      uVar21 = (ulong)((int)uVar21 + 1);
      uVar17 = (ulong)pbVar19[1];
      pbVar19 = pbVar19 + 1;
    }
  }
  else {
    while( true ) {
      uVar16 = (uint)uVar17;
      if (9 < (byte)((byte)uVar17 - 0x30)) break;
      if ((0x1999999999999998 < v) && (0x35 < (byte)uVar17 || v != 0x1999999999999999))
      goto LAB_001a112e;
      v = (uVar17 & 0xf) + v * 10;
      uVar21 = (ulong)((int)uVar21 + 1);
      uVar17 = (ulong)pbVar19[1];
      pbVar19 = pbVar19 + 1;
    }
  }
  dVar23 = 0.0;
  bVar7 = true;
  bVar22 = false;
  bVar8 = false;
  goto LAB_001a11a5;
LAB_001a112e:
  auVar24._8_4_ = (int)(v >> 0x20);
  auVar24._0_8_ = v;
  auVar24._12_4_ = 0x45300000;
  dVar23 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0);
  while (uVar16 = (uint)uVar17, (byte)((char)uVar17 - 0x30U) < 10) {
    pbVar20 = pbVar5;
    if (1.7976931348623158e+307 <= dVar23) goto LAB_001a1470;
    dVar23 = dVar23 * 10.0 + (double)(int)(uVar16 - 0x30);
    pbVar20 = pbVar19 + 1;
    pbVar19 = pbVar19 + 1;
    uVar17 = (ulong)*pbVar20;
  }
  bVar22 = true;
  bVar8 = true;
  bVar7 = true;
LAB_001a11a5:
  if ((char)uVar16 == '.') {
    pbVar20 = pbVar19 + 1;
    uVar16 = (uint)*pbVar20;
    pbVar19 = pbVar19 + 1;
    if ((byte)(*pbVar20 - 0x3a) < 0xf6) {
      uVar12 = 0xe;
      pbVar20 = pbVar19;
      goto LAB_001a1470;
    }
    iVar18 = 0;
    if (!bVar22) {
      if (!bVar7) {
        v = (ulong)v_00;
      }
      iVar18 = 0;
      while ((('/' < (char)(byte)uVar16 && ((byte)uVar16 < 0x3a)) && (v >> 0x35 == 0))) {
        pbVar20 = pbVar19 + 1;
        pbVar19 = pbVar19 + 1;
        iVar18 = iVar18 + -1;
        v = (ulong)(uVar16 - 0x30) + v * 10;
        uVar21 = (ulong)((int)uVar21 + (uint)(v != 0));
        uVar16 = (uint)*pbVar20;
      }
      auVar25._8_4_ = (int)(v >> 0x20);
      auVar25._0_8_ = v;
      auVar25._12_4_ = 0x45300000;
      dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0);
      bVar8 = true;
    }
    while ('/' < (char)(byte)uVar16) {
      if (0x39 < (byte)uVar16) goto LAB_001a12cb;
      if ((int)uVar21 < 0x11) {
        dVar23 = dVar23 * 10.0 + (double)(int)(uVar16 - 0x30);
        iVar18 = iVar18 + -1;
        if (0.0 < dVar23) {
          uVar21 = (ulong)((int)uVar21 + 1);
        }
      }
      pbVar20 = pbVar19 + 1;
      pbVar19 = pbVar19 + 1;
      uVar16 = (uint)*pbVar20;
    }
    iVar15 = 0;
LAB_001a13cc:
    if (bVar8) {
      dVar23 = internal::StrtodNormalPrecision(dVar23,iVar15 + iVar18);
      if (bVar3 == 0x2d) {
        dVar23 = -dVar23;
      }
      bVar22 = VWReaderHandler<false>::Double(handler,dVar23);
    }
    else if (bVar7) {
      if (bVar3 == 0x2d) {
        bVar22 = VWReaderHandler<false>::Int64(handler,-v);
      }
      else {
        bVar22 = VWReaderHandler<false>::Uint64(handler,v);
      }
    }
    else if (bVar3 == 0x2d) {
      bVar22 = VWReaderHandler<false>::Int(handler,-v_00);
    }
    else {
      bVar22 = VWReaderHandler<false>::Uint(handler,v_00);
    }
    if (bVar22 != false) goto LAB_001a143b;
    uVar12 = 0x10;
    pbVar20 = pbVar5;
  }
  else {
    iVar18 = 0;
LAB_001a12cb:
    iVar15 = 0;
    if ((uVar16 | 0x20) != 0x65) goto LAB_001a13cc;
    uVar21 = (ulong)v_00;
    if (bVar7) {
      uVar21 = v;
    }
    if (!bVar8) {
      auVar26._8_4_ = (int)(uVar21 >> 0x20);
      auVar26._0_8_ = uVar21;
      auVar26._12_4_ = 0x45300000;
      dVar23 = (auVar26._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0);
      bVar8 = true;
    }
    bVar9 = pbVar19[1];
    bVar22 = bVar9 != 0x2b;
    if ((bVar22) && (bVar9 != 0x2d)) {
      pbVar20 = pbVar19 + 1;
      bVar22 = false;
    }
    else {
      bVar9 = pbVar19[2];
      pbVar20 = pbVar19 + 2;
    }
    if ((byte)(bVar9 - 0x30) < 10) {
      pbVar19 = pbVar20 + 1;
      iVar13 = bVar9 - 0x30;
      pbVar20 = pbVar19;
      if (bVar22) {
        while (pbVar19 = pbVar20, (byte)(*pbVar19 - 0x30) < 10) {
          iVar13 = iVar13 * 10 + (uint)*pbVar19 + -0x30;
          pbVar20 = pbVar19 + 1;
          if (0xccccccb < iVar13) {
            do {
              pbVar1 = pbVar19 + 1;
              pbVar19 = pbVar19 + 1;
              pbVar20 = pbVar19;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
        }
LAB_001a13c3:
        iVar15 = -iVar13;
        if (!bVar22) {
          iVar15 = iVar13;
        }
        goto LAB_001a13cc;
      }
      do {
        bVar9 = *pbVar19;
        if (9 < (byte)(bVar9 - 0x30)) goto LAB_001a13c3;
        pbVar19 = pbVar19 + 1;
        iVar13 = iVar13 * 10 + (uint)bVar9 + -0x30;
      } while (iVar13 <= 0x134 - iVar18);
      uVar12 = 0xd;
      pbVar20 = pbVar5;
    }
    else {
      uVar12 = 0xf;
      pbVar19 = pbVar20;
    }
  }
LAB_001a1470:
  *(undefined4 *)(this + 0x30) = uVar12;
  *(long *)(this + 0x38) = (long)pbVar20 - (long)pCVar6;
LAB_001a143b:
  is->src_ = (Ch *)pbVar19;
  is->dst_ = pCVar10;
  is->head_ = pCVar6;
  return;
}

Assistant:

Ch Peek() { return *src_; }